

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::UntypedMapBase::TransferTree
          (UntypedMapBase *this,Tree *tree,GetKey get_key)

{
  VariantKey key;
  bool bVar1;
  uint *puVar2;
  map_index_t local_34;
  NodeBase *pNStack_30;
  map_index_t b;
  NodeBase *next;
  NodeBase *node;
  GetKey get_key_local;
  Tree *tree_local;
  UntypedMapBase *this_local;
  
  node = (NodeBase *)get_key;
  get_key_local = (GetKey)tree;
  tree_local = (Tree *)this;
  next = DestroyTree(this,tree);
  do {
    pNStack_30 = next->next;
    key = (VariantKey)(*(code *)node)(next);
    local_34 = VariantBucketNumber(this,key);
    bVar1 = TableEntryIsEmpty(this,local_34);
    if (bVar1) {
      InsertUniqueInList(this,local_34,next);
      puVar2 = std::min<unsigned_int>(&this->index_of_first_non_null_,&local_34);
      this->index_of_first_non_null_ = *puVar2;
    }
    else {
      bVar1 = TableEntryIsNonEmptyList(this,local_34);
      if ((!bVar1) || (bVar1 = TableEntryIsTooLong(this,local_34), bVar1)) {
        InsertUniqueInTree(this,local_34,(GetKey)node,next);
      }
      else {
        InsertUniqueInList(this,local_34,next);
      }
    }
    next = pNStack_30;
  } while (pNStack_30 != (NodeBase *)0x0);
  return;
}

Assistant:

void UntypedMapBase::TransferTree(Tree* tree, GetKey get_key) {
  NodeBase* node = DestroyTree(tree);
  do {
    NodeBase* next = node->next;

    map_index_t b = VariantBucketNumber(get_key(node));
    // This is similar to InsertUnique, but with erasure.
    if (TableEntryIsEmpty(b)) {
      InsertUniqueInList(b, node);
      index_of_first_non_null_ = (std::min)(index_of_first_non_null_, b);
    } else if (TableEntryIsNonEmptyList(b) && !TableEntryIsTooLong(b)) {
      InsertUniqueInList(b, node);
    } else {
      InsertUniqueInTree(b, get_key, node);
    }

    node = next;
  } while (node != nullptr);
}